

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QOscMessage>::copyAppend
          (QGenericArrayOps<QOscMessage> *this,QOscMessage *b,QOscMessage *e)

{
  QOscMessage *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QOscMessage>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QOscMessage>).size;
    do {
      pQVar1[lVar4].m_isValid = b->m_isValid;
      pDVar2 = (b->m_addressPattern).d.d;
      pQVar1[lVar4].m_addressPattern.d.d = pDVar2;
      pQVar1[lVar4].m_addressPattern.d.ptr = (b->m_addressPattern).d.ptr;
      pQVar1[lVar4].m_addressPattern.d.size = (b->m_addressPattern).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar3 = (b->m_arguments).d.d;
      pQVar1[lVar4].m_arguments.d.d = pDVar3;
      pQVar1[lVar4].m_arguments.d.ptr = (b->m_arguments).d.ptr;
      pQVar1[lVar4].m_arguments.d.size = (b->m_arguments).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QOscMessage>).size + 1;
      (this->super_QArrayDataPointer<QOscMessage>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }